

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::MergeFrom
          (Value_ImmediateValue *this,Value_ImmediateValue *from)

{
  LogMessage *other;
  TensorValue *this_00;
  ListValue *this_01;
  DictionaryValue *this_02;
  TupleValue *this_03;
  undefined1 *puVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/MIL.pb.cc"
               ,0x1599);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    this_00 = _internal_mutable_tensor(this);
    if (from->_oneof_case_[0] == 1) {
      puVar1 = (undefined1 *)(from->value_).tensor_;
    }
    else {
      puVar1 = _TensorValue_default_instance_;
    }
    TensorValue::MergeFrom(this_00,(TensorValue *)puVar1);
    break;
  case 2:
    this_03 = _internal_mutable_tuple(this);
    if (from->_oneof_case_[0] == 2) {
      puVar1 = (undefined1 *)(from->value_).tuple_;
    }
    else {
      puVar1 = _TupleValue_default_instance_;
    }
    TupleValue::MergeFrom(this_03,(TupleValue *)puVar1);
    break;
  case 3:
    this_01 = _internal_mutable_list(this);
    if (from->_oneof_case_[0] == 3) {
      puVar1 = (undefined1 *)(from->value_).list_;
    }
    else {
      puVar1 = _ListValue_default_instance_;
    }
    ListValue::MergeFrom(this_01,(ListValue *)puVar1);
    break;
  case 4:
    this_02 = _internal_mutable_dictionary(this);
    if (from->_oneof_case_[0] == 4) {
      puVar1 = (undefined1 *)(from->value_).dictionary_;
    }
    else {
      puVar1 = _DictionaryValue_default_instance_;
    }
    DictionaryValue::MergeFrom(this_02,(DictionaryValue *)puVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Value_ImmediateValue::MergeFrom(const Value_ImmediateValue& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Value.ImmediateValue)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.value_case()) {
    case kTensor: {
      _internal_mutable_tensor()->::CoreML::Specification::MILSpec::TensorValue::MergeFrom(from._internal_tensor());
      break;
    }
    case kTuple: {
      _internal_mutable_tuple()->::CoreML::Specification::MILSpec::TupleValue::MergeFrom(from._internal_tuple());
      break;
    }
    case kList: {
      _internal_mutable_list()->::CoreML::Specification::MILSpec::ListValue::MergeFrom(from._internal_list());
      break;
    }
    case kDictionary: {
      _internal_mutable_dictionary()->::CoreML::Specification::MILSpec::DictionaryValue::MergeFrom(from._internal_dictionary());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}